

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O2

int Acb_ObjLabelTfo_rec(Acb_Ntk_t *p,int iObj,int nTfoLevMax,int nFanMax,int fFirst)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Acb_ObjType_t AVar5;
  int iVar6;
  Vec_Int_t *pVVar7;
  uint d;
  
  iVar2 = Acb_ObjTravIdDiff(p,iObj);
  if (iVar2 < 3) {
    return iVar2;
  }
  Acb_ObjSetTravIdDiff(p,iObj,2);
  iVar3 = Acb_ObjIsCo(p,iObj);
  if (iVar3 != 0) {
    return 2;
  }
  iVar3 = Acb_ObjLevelD(p,iObj);
  if (nTfoLevMax < iVar3) {
    return 2;
  }
  iVar3 = Acb_ObjLevelD(p,iObj);
  if ((iVar3 == nTfoLevMax) || (iVar3 = Acb_ObjFanoutNum(p,iObj), nFanMax < iVar3)) {
    if (iVar2 != 3) goto LAB_003311d4;
    d = 1;
  }
  else {
    bVar1 = false;
    for (iVar3 = 0; pVVar7 = Vec_WecEntry(&p->vFanouts,iObj), iVar3 < pVVar7->nSize;
        iVar3 = iVar3 + 1) {
      pVVar7 = Vec_WecEntry(&p->vFanouts,iObj);
      iVar4 = Vec_IntEntry(pVVar7,iVar3);
      AVar5 = Acb_ObjType(p,iVar4);
      if ((AVar5 != ABC_OPER_NONE) &&
         ((fFirst == 0 || (iVar6 = Acb_ObjIsDelayCriticalFanin(p,iVar4,iObj), iVar6 != 0)))) {
        iVar4 = Acb_ObjLabelTfo_rec(p,iVar4,nTfoLevMax,nFanMax,0);
        bVar1 = (bool)(bVar1 | iVar4 == 2);
      }
    }
    d = (uint)(iVar2 == 3 && bVar1);
    if ((iVar2 != 3) && (bVar1)) goto LAB_003311d4;
  }
  Acb_ObjSetTravIdDiff(p,iObj,d);
LAB_003311d4:
  iVar2 = Acb_ObjTravIdDiff(p,iObj);
  return iVar2;
}

Assistant:

int Acb_ObjLabelTfo_rec( Acb_Ntk_t * p, int iObj, int nTfoLevMax, int nFanMax, int fFirst )
{
    int iFanout, i, Diff, fHasNone = 0;
    if ( (Diff = Acb_ObjTravIdDiff(p, iObj)) <= 2 )
        return Diff;
    Acb_ObjSetTravIdDiff( p, iObj, 2 );
    if ( Acb_ObjIsCo(p, iObj) || Acb_ObjLevelD(p, iObj) > nTfoLevMax )
        return 2;
    if ( Acb_ObjLevelD(p, iObj) == nTfoLevMax || Acb_ObjFanoutNum(p, iObj) > nFanMax )
    {
        if ( Diff == 3 )  // belongs to TFO of TFI
            Acb_ObjSetTravIdDiff( p, iObj, 1 ); // root
        return Acb_ObjTravIdDiff(p, iObj);
    }
    Acb_ObjForEachFanout( p, iObj, iFanout, i )
        if ( !fFirst || Acb_ObjIsDelayCriticalFanin(p, iFanout, iObj) )
            fHasNone |= 2 == Acb_ObjLabelTfo_rec( p, iFanout, nTfoLevMax, nFanMax, 0 );
    if ( fHasNone && Diff == 3 )  // belongs to TFO of TFI
        Acb_ObjSetTravIdDiff( p, iObj, 1 ); // root
    else if ( !fHasNone )
        Acb_ObjSetTravIdDiff( p, iObj, 0 ); // inner
    return Acb_ObjTravIdDiff(p, iObj);
}